

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O3

bool tinyusdz::IsUSD(string *filename,string *detected_format)

{
  bool bVar1;
  char *pcVar2;
  
  bVar1 = IsUSDA(filename);
  if (bVar1) {
    if (detected_format == (string *)0x0) {
      return true;
    }
    pcVar2 = "usda";
  }
  else {
    bVar1 = IsUSDC(filename);
    if (bVar1) {
      if (detected_format == (string *)0x0) {
        return true;
      }
      pcVar2 = "usdc";
    }
    else {
      bVar1 = IsUSDZ(filename);
      if (!bVar1) {
        return false;
      }
      if (detected_format == (string *)0x0) {
        return true;
      }
      pcVar2 = "usdz";
    }
  }
  ::std::__cxx11::string::_M_replace
            ((ulong)detected_format,0,(char *)detected_format->_M_string_length,(ulong)pcVar2);
  return true;
}

Assistant:

bool IsUSD(const std::string &filename, std::string *detected_format) {
  if (IsUSDA(filename)) {
    if (detected_format) {
      (*detected_format) = "usda";
    }
    return true;
  }

  if (IsUSDC(filename)) {
    if (detected_format) {
      (*detected_format) = "usdc";
    }
    return true;
  }

  if (IsUSDZ(filename)) {
    if (detected_format) {
      (*detected_format) = "usdz";
    }
    return true;
  }

  return false;
}